

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

int lyht_find_collision(hash_table *ht,ht_rec **last,ht_rec *first)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ht_rec *phVar7;
  ht_rec *__dest;
  ht_rec *phVar8;
  
  if ((last == (ht_rec **)0x0) || (phVar7 = *last, phVar7 == (ht_rec *)0x0)) {
    __assert_fail("last && *last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                  ,0x1d1,
                  "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)")
    ;
  }
  uVar2 = phVar7->hash;
  uVar3 = ht->size;
  uVar1 = ht->rec_size;
  uVar6 = (ulong)((int)(((long)phVar7 - (long)ht->recs) / (long)(ulong)uVar1) + 1) % (ulong)uVar3;
  phVar7 = (ht_rec *)(ht->recs + (int)uVar6 * (uint)uVar1);
  *last = phVar7;
  if (phVar7 == first) {
    __dest = (ht_rec *)0x0;
  }
  else {
    __dest = (ht_rec *)0x0;
    do {
      phVar8 = phVar7;
      if (__dest != (ht_rec *)0x0) {
        phVar8 = __dest;
      }
      iVar4 = phVar7->hits;
      if ((iVar4 != -1) &&
         ((iVar4 == 0 || (phVar8 = __dest, ((phVar7->hash ^ uVar2) & uVar3 - 1) == 0)))) {
        if (iVar4 < 1) {
          iVar4 = 1;
          if (__dest == (ht_rec *)0x0) {
            return 1;
          }
        }
        else {
          if (iVar4 != 1) {
            __assert_fail("(*last)->hits == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                          ,0x1e8,
                          "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)"
                         );
          }
          if (__dest == (ht_rec *)0x0) {
            return 0;
          }
          memcpy(__dest,phVar7,(ulong)uVar1);
          (*last)->hits = -1;
          iVar4 = 0;
        }
        goto LAB_00110e7f;
      }
      __dest = phVar8;
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      if (uVar5 == uVar3) {
        uVar6 = 0;
      }
      phVar7 = (ht_rec *)(ht->recs + (int)uVar6 * (uint)uVar1);
      *last = phVar7;
    } while (phVar7 != first);
  }
  iVar4 = 1;
  if (__dest == (ht_rec *)0x0) {
    __assert_fail("inval_rec",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                  ,0x1dc,
                  "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)")
    ;
  }
LAB_00110e7f:
  *last = __dest;
  return iVar4;
}

Assistant:

static int
lyht_find_collision(struct hash_table *ht, struct ht_rec **last, struct ht_rec *first)
{
    struct ht_rec *inval_rec = NULL;
    uint32_t i, idx;

    assert(last && *last);

    idx = (*last)->hash & (ht->size - 1);
    i = (((unsigned char *)*last) - ht->recs) / ht->rec_size;

    do {
        i = (i + 1) % ht->size;
        *last = lyht_get_rec(ht->recs, ht->rec_size, i);
        if (*last == first) {
            /* we went through all the records (very unlikely, but possible when many records are invalid),
             * just return an invalid record */
            assert(inval_rec);
            *last = inval_rec;
            return 1;
        }

        if (((*last)->hits == -1) && !inval_rec) {
            inval_rec = *last;
        }
    } while (((*last)->hits != 0) && (((*last)->hits == -1) || (((*last)->hash & (ht->size - 1)) != idx)));

    if ((*last)->hits > 0) {
        /* we found a collision, so move it to the first invalid record so the next search is faster */
        assert((*last)->hits == 1);
        if (inval_rec) {
            memcpy(inval_rec, *last, ht->rec_size);
            (*last)->hits = -1;
            *last = inval_rec;
        }
        return 0;
    }

    /* no next collision found, return the record where it would be inserted */
    if (inval_rec) {
        *last = inval_rec;
    } /* else (*last)->hits == 0, it is already correct */
    return 1;
}